

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

fio_str_info_s * fio_str_info(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s)

{
  byte bVar1;
  char *pcVar2;
  uint64_t uVar3;
  size_t sVar4;
  
  if (s == (fio_str_s_conflict *)0x0) {
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 0;
    __return_storage_ptr__->data = (char *)0x0;
    return __return_storage_ptr__;
  }
  bVar1 = s->small;
  if ((bVar1 == 0) && (pcVar2 = s->data, pcVar2 != (char *)0x0)) {
    if (s->frozen == '\0') {
      uVar3 = s->capa;
    }
    else {
      uVar3 = 0;
    }
    __return_storage_ptr__->capa = uVar3;
    __return_storage_ptr__->len = s->len;
    __return_storage_ptr__->data = pcVar2;
    return __return_storage_ptr__;
  }
  sVar4 = 0x2d;
  if (s->frozen != '\0') {
    sVar4 = 0;
  }
  __return_storage_ptr__->capa = sVar4;
  __return_storage_ptr__->len = (ulong)(bVar1 >> 1);
  __return_storage_ptr__->data = (char *)s->reserved;
  return __return_storage_ptr__;
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_info(const fio_str_s *s) {
  if (!s)
    return (fio_str_info_s){.len = 0};
  return (s->small || !s->data)
             ? (fio_str_info_s){.capa =
                                    (s->frozen ? 0 : (FIO_STR_SMALL_CAPA - 1)),
                                .len = (size_t)(s->small >> 1),
                                .data = FIO_STR_SMALL_DATA(s)}
             : (fio_str_info_s){.capa = (s->frozen ? 0 : s->capa),
                                .len = s->len,
                                .data = s->data};
}